

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

unique_ptr<Catch::IStream> __thiscall Catch::makeStream(Catch *this,string *filename)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  ReusableStringStream *pRVar4;
  unique_ptr<Catch::Detail::(anonymous_namespace)::FileStream> local_88;
  char local_79;
  ReusableStringStream local_78;
  string local_68;
  unique_ptr<Catch::Detail::(anonymous_namespace)::CoutStream> local_48;
  unique_ptr<Catch::Detail::(anonymous_namespace)::CerrStream> local_40;
  unique_ptr<Catch::Detail::(anonymous_namespace)::DebugOutStream> local_38 [3];
  unique_ptr<Catch::Detail::(anonymous_namespace)::CoutStream> local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  string *filename_local;
  
  local_18 = filename;
  filename_local = (string *)this;
  uVar2 = std::__cxx11::string::empty();
  if (((uVar2 & 1) != 0) || (bVar1 = std::operator==(local_18,"-"), bVar1)) {
    Detail::make_unique<Catch::Detail::(anonymous_namespace)::CoutStream>();
    Detail::unique_ptr<Catch::IStream>::
    unique_ptr<Catch::Detail::(anonymous_namespace)::CoutStream,void>
              ((unique_ptr<Catch::IStream> *)this,&local_20);
    Detail::unique_ptr<Catch::Detail::(anonymous_namespace)::CoutStream>::~unique_ptr(&local_20);
    return (unique_ptr<Catch::IStream>)(IStream *)this;
  }
  pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_18);
  if (*pcVar3 != '%') {
    Detail::
    make_unique<Catch::Detail::(anonymous_namespace)::FileStream,std::__cxx11::string_const&>
              ((Detail *)&local_88,local_18);
    Detail::unique_ptr<Catch::IStream>::
    unique_ptr<Catch::Detail::(anonymous_namespace)::FileStream,void>
              ((unique_ptr<Catch::IStream> *)this,&local_88);
    Detail::unique_ptr<Catch::Detail::(anonymous_namespace)::FileStream>::~unique_ptr(&local_88);
    return (unique_ptr<Catch::IStream>)(IStream *)this;
  }
  bVar1 = std::operator==(local_18,"%debug");
  if (!bVar1) {
    bVar1 = std::operator==(local_18,"%stderr");
    if (bVar1) {
      Detail::make_unique<Catch::Detail::(anonymous_namespace)::CerrStream>();
      Detail::unique_ptr<Catch::IStream>::
      unique_ptr<Catch::Detail::(anonymous_namespace)::CerrStream,void>
                ((unique_ptr<Catch::IStream> *)this,&local_40);
      Detail::unique_ptr<Catch::Detail::(anonymous_namespace)::CerrStream>::~unique_ptr(&local_40);
      return (unique_ptr<Catch::IStream>)(IStream *)this;
    }
    bVar1 = std::operator==(local_18,"%stdout");
    if (bVar1) {
      Detail::make_unique<Catch::Detail::(anonymous_namespace)::CoutStream>();
      Detail::unique_ptr<Catch::IStream>::
      unique_ptr<Catch::Detail::(anonymous_namespace)::CoutStream,void>
                ((unique_ptr<Catch::IStream> *)this,&local_48);
      Detail::unique_ptr<Catch::Detail::(anonymous_namespace)::CoutStream>::~unique_ptr(&local_48);
      return (unique_ptr<Catch::IStream>)(IStream *)this;
    }
    ReusableStringStream::ReusableStringStream(&local_78);
    pRVar4 = ReusableStringStream::operator<<(&local_78,(char (*) [23])"Unrecognised stream: \'");
    pRVar4 = ReusableStringStream::operator<<(pRVar4,local_18);
    local_79 = '\'';
    pRVar4 = ReusableStringStream::operator<<(pRVar4,&local_79);
    ReusableStringStream::str_abi_cxx11_(&local_68,pRVar4);
    throw_domain_error(&local_68);
  }
  Detail::make_unique<Catch::Detail::(anonymous_namespace)::DebugOutStream>();
  Detail::unique_ptr<Catch::IStream>::
  unique_ptr<Catch::Detail::(anonymous_namespace)::DebugOutStream,void>
            ((unique_ptr<Catch::IStream> *)this,local_38);
  Detail::unique_ptr<Catch::Detail::(anonymous_namespace)::DebugOutStream>::~unique_ptr(local_38);
  return (unique_ptr<Catch::IStream>)(IStream *)this;
}

Assistant:

auto makeStream( std::string const& filename ) -> Detail::unique_ptr<IStream> {
        if ( filename.empty() || filename == "-" ) {
            return Detail::make_unique<Detail::CoutStream>();
        }
        if( filename[0] == '%' ) {
            if ( filename == "%debug" ) {
                return Detail::make_unique<Detail::DebugOutStream>();
            } else if ( filename == "%stderr" ) {
                return Detail::make_unique<Detail::CerrStream>();
            } else if ( filename == "%stdout" ) {
                return Detail::make_unique<Detail::CoutStream>();
            } else {
                CATCH_ERROR( "Unrecognised stream: '" << filename << '\'' );
            }
        }
        return Detail::make_unique<Detail::FileStream>( filename );
    }